

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool roaring_bitmap_run_optimize(roaring_bitmap_t *r)

{
  uint8_t *puVar1;
  undefined8 in_RAX;
  shared_container_t *sc;
  container_t *pcVar2;
  ulong uVar3;
  _Bool _Var4;
  ulong uVar5;
  ulong uVar6;
  uint8_t type_after;
  undefined8 uStack_38;
  
  if ((r->high_low_container).size < 1) {
    _Var4 = false;
  }
  else {
    uVar5 = 0;
    _Var4 = false;
    uStack_38 = in_RAX;
    do {
      uVar6 = uVar5 & 0xffff;
      puVar1 = (r->high_low_container).typecodes;
      sc = (shared_container_t *)(r->high_low_container).containers[uVar6];
      if (puVar1[uVar6] == '\x04') {
        sc = (shared_container_t *)shared_container_extract_copy(sc,puVar1 + uVar6);
      }
      uVar3 = (ulong)(uint)((int)uVar6 * 8);
      *(shared_container_t **)((long)(r->high_low_container).containers + uVar3) = sc;
      pcVar2 = convert_run_optimize
                         (*(container_t **)((long)(r->high_low_container).containers + uVar3),
                          (r->high_low_container).typecodes[uVar6],(uint8_t *)((long)&uStack_38 + 7)
                         );
      if (uStack_38._7_1_ == '\x03') {
        _Var4 = true;
      }
      (r->high_low_container).containers[uVar5] = pcVar2;
      (r->high_low_container).typecodes[uVar5] = uStack_38._7_1_;
      uVar5 = uVar5 + 1;
    } while ((long)uVar5 < (long)(r->high_low_container).size);
  }
  return _Var4;
}

Assistant:

bool roaring_bitmap_run_optimize(roaring_bitmap_t *r) {
    bool answer = false;
    for (int i = 0; i < r->high_low_container.size; i++) {
        uint8_t type_original, type_after;
        ra_unshare_container_at_index(
            &r->high_low_container,
            (uint16_t)i);  // TODO: this introduces extra cloning!
        container_t *c = ra_get_container_at_index(&r->high_low_container,
                                                   (uint16_t)i, &type_original);
        container_t *c1 = convert_run_optimize(c, type_original, &type_after);
        if (type_after == RUN_CONTAINER_TYPE) {
            answer = true;
        }
        ra_set_container_at_index(&r->high_low_container, i, c1, type_after);
    }
    return answer;
}